

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O2

int __thiscall QTextDocumentPrivate::undoRedo(QTextDocumentPrivate *this,bool undo)

{
  BlockMap *this_00;
  pointer pQVar1;
  ushort uVar2;
  quint32 pos;
  _func_int **pp_Var3;
  QTextBlockData *pQVar4;
  Header *pHVar5;
  QTextUndoCommand *pQVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  pointer pQVar11;
  QObject *pQVar12;
  QTextBlockGroup *pQVar13;
  QTextBlockGroup *pQVar14;
  QTextObject *obj;
  ulong uVar15;
  int iVar16;
  uint pos_00;
  uint uVar17;
  uint uVar18;
  long in_FS_OFFSET;
  bool bVar19;
  long lStackY_90;
  int local_78;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  int *local_38;
  
  local_38 = *(int **)(in_FS_OFFSET + 0x28);
  iVar9 = -1;
  if (((this->undoEnabled == true) && (!undo || this->undoState != 0)) &&
     ((undo || ((this->undoStack).d.size != (long)this->undoState)))) {
    this->undoEnabled = false;
    beginEditBlock(this);
    this_00 = &this->blocks;
    uVar7 = this->undoState;
    uVar17 = 0xffffffff;
    local_78 = -1;
    do {
      if (undo) {
        uVar7 = uVar7 - 1;
        this->undoState = uVar7;
      }
      pQVar11 = QList<QTextUndoCommand>::data(&this->undoStack);
      pQVar1 = pQVar11 + (int)uVar7;
      pos_00 = pQVar11[(int)uVar7].pos;
      uVar2 = pQVar11[(int)uVar7].command;
      iVar9 = (int)&this->formats;
      switch(uVar2) {
      case 0:
        remove(this,(char *)(ulong)pos_00);
        pQVar1->command = 1;
        goto LAB_004610c1;
      case 1:
        insert_string(this,pos_00,pQVar1->strPos,(pQVar1->field_8).length,pQVar1->format,
                      (uint)pQVar1->operation);
        pQVar1->command = 0;
        uVar18 = pQVar1->pos;
        if (uVar17 != uVar18) {
          local_78 = 0;
        }
        local_78 = local_78 + (pQVar1->field_8).blockFormat;
        break;
      case 2:
        local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        find((QTextDocumentPrivate *)local_48,(int)this);
        iVar10 = *(int *)(*(long *)local_48._0_8_ + 0x1c + (local_48._8_8_ & 0xffffffff) * 0x20);
        pos = pQVar1->pos;
        iVar16 = (pQVar1->field_8).blockFormat;
        QTextFormatCollection::charFormat((QTextFormatCollection *)local_58,iVar9);
        setCharFormat(this,pos,iVar16,(QTextCharFormat *)local_58,SetFormat);
        QTextFormat::~QTextFormat((QTextFormat *)local_58);
        pQVar1->format = iVar10;
        uVar18 = pQVar1->pos;
        if (uVar17 != uVar18) {
          local_78 = 0;
        }
        local_78 = local_78 + (pQVar1->field_8).blockFormat;
        goto LAB_00461184;
      case 3:
        local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        uVar8 = QFragmentMapData<QTextBlockData>::findNode(&this_00->data,pQVar1->pos,0);
        local_48._8_4_ = uVar8;
        pQVar4 = (this->blocks).data.field_0.fragments;
        iVar10 = pQVar4[uVar8].format;
        pQVar4[uVar8].format = pQVar1->format;
        local_48._0_8_ = this;
        QTextFormatCollection::blockFormat((QTextFormatCollection *)local_58,iVar9);
        pQVar12 = &objectForFormat(this,(QTextFormat *)local_58)->super_QObject;
        pQVar13 = QtPrivate::qobject_cast_helper<QTextBlockGroup*,QObject>(pQVar12);
        QTextFormat::~QTextFormat((QTextFormat *)local_58);
        QTextFormatCollection::blockFormat((QTextFormatCollection *)local_58,iVar9);
        pQVar12 = &objectForFormat(this,(QTextFormat *)local_58)->super_QObject;
        pQVar14 = QtPrivate::qobject_cast_helper<QTextBlockGroup*,QObject>(pQVar12);
        QTextFormat::~QTextFormat((QTextFormat *)local_58);
        pQVar1->format = iVar10;
        if (pQVar14 == pQVar13) {
          lStackY_90 = 0x70;
        }
        else {
          if (pQVar13 != (QTextBlockGroup *)0x0) {
            (**(code **)(*(long *)&pQVar13->super_QTextObject + 0x68))(pQVar13,local_48);
          }
          lStackY_90 = 0x60;
          pQVar13 = pQVar14;
        }
        if (pQVar13 != (QTextBlockGroup *)0x0) {
          (**(code **)(*(long *)&pQVar14->super_QTextObject + lStackY_90))(pQVar14,local_48);
        }
        iVar9 = QTextBlock::position((QTextBlock *)local_48);
        iVar10 = QTextBlock::length((QTextBlock *)local_48);
        documentChange(this,iVar9,iVar10);
        goto LAB_00461180;
      case 4:
      case 6:
        remove_block(this,pos_00,&(pQVar1->field_8).blockFormat,(uint)uVar2,(uint)pQVar1->operation)
        ;
        pQVar1->command = (ushort)(pQVar1->command != 4) * 2 + 5;
LAB_004610c1:
        uVar18 = pQVar1->pos;
        local_78 = 0;
        break;
      case 5:
      case 7:
        insert_block(this,pos_00,pQVar1->strPos,pQVar1->format,(pQVar1->field_8).blockFormat,
                     (uint)pQVar1->operation,(uint)uVar2);
        pos_00 = pos_00 + 1;
        bVar19 = pQVar1->command != 5;
        pQVar1->command = bVar19 + 4 + (ushort)bVar19;
        uVar18 = pQVar1->pos;
        local_78 = local_78 + 1;
        if (uVar17 != uVar18) {
          local_78 = 1;
        }
        break;
      case 8:
        obj = objectForIndex(this,(pQVar1->field_8).blockFormat);
        iVar9 = QTextFormatCollection::objectFormatIndex
                          (&this->formats,(pQVar1->field_8).blockFormat);
        changeObjectFormat(this,obj,pQVar1->format);
        pQVar1->format = iVar9;
LAB_00461180:
        uVar18 = 0xffffffff;
        goto LAB_00461184;
      case 9:
        local_78 = 0;
        uVar18 = pos_00;
        break;
      default:
        uVar18 = uVar17;
        if (uVar2 != 0x100) break;
        pp_Var3 = ((pQVar1->field_8).custom)->_vptr_QAbstractUndoItem;
        if (!undo) {
          (*pp_Var3[3])();
          uVar18 = 0xffffffff;
          goto LAB_00461198;
        }
        (*pp_Var3[2])();
        uVar18 = 0xffffffff;
        goto LAB_00461189;
      }
      if (-1 < (int)pos_00) {
        uVar8 = QFragmentMapData<QTextBlockData>::findNode(&this_00->data,pos_00,0);
        pHVar5 = (this_00->data).field_0.head;
        *(uint *)((long)pHVar5 + (ulong)uVar8 * 0x48 + 0x44) =
             *(uint *)((long)pHVar5 + (ulong)uVar8 * 0x48 + 0x44) & 0x80000000 |
             pQVar1->revision & 0x7fffffff;
      }
LAB_00461184:
      if (undo) {
LAB_00461189:
        uVar7 = this->undoState;
        uVar17 = uVar18;
      }
      else {
LAB_00461198:
        uVar7 = this->undoState + 1;
        this->undoState = uVar7;
        uVar17 = uVar18;
      }
    } while ((((0 < (int)uVar7) && (uVar15 = (ulong)uVar7, uVar15 < (ulong)(this->undoStack).d.size)
              ) && (pQVar6 = (this->undoStack).d.ptr, (pQVar6[uVar15].field_0x2 & 1) != 0)) &&
            ((pQVar6[uVar15 - 1].field_0x2 & 3) == 1));
    this->undoEnabled = true;
    if ((int)uVar17 < 0) {
      if (this->docChangeFrom < 0) {
        iVar9 = -1;
      }
      else {
        iVar16 = this->docChangeFrom + this->docChangeLength;
        iVar10 = length(this);
        iVar9 = iVar10 + -1;
        if (iVar16 < iVar10 + -1) {
          iVar9 = iVar16;
        }
      }
    }
    else {
      iVar9 = uVar17 + local_78;
    }
    endEditBlock(this);
    emitUndoAvailable(this,(bool)(0 < this->undoState & this->undoEnabled));
    if (this->undoEnabled == true) {
      bVar19 = (long)this->undoState < (this->undoStack).d.size;
    }
    else {
      bVar19 = false;
    }
    emitRedoAvailable(this,bVar19);
  }
  if (*(int **)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar9;
  }
  __stack_chk_fail();
}

Assistant:

int QTextDocumentPrivate::undoRedo(bool undo)
{
    PMDEBUG("%s, undoState=%d, undoStack size=%d", undo ? "undo:" : "redo:", undoState, int(undoStack.size()));
    if (!undoEnabled || (undo && undoState == 0) || (!undo && undoState == undoStack.size()))
        return -1;

    undoEnabled = false;
    beginEditBlock();
    int editPos = -1;
    int editLength = -1;
    while (1) {
        if (undo)
            --undoState;
        QTextUndoCommand &c = undoStack[undoState];
        int resetBlockRevision = c.pos;

        switch (c.command) {
        case QTextUndoCommand::Inserted:
            remove(c.pos, c.length, (QTextUndoCommand::Operation)c.operation);
            PMDEBUG("   erase: from %d, length %d", c.pos, c.length);
            c.command = QTextUndoCommand::Removed;
            editPos = c.pos;
            editLength = 0;
            break;
        case QTextUndoCommand::Removed:
            PMDEBUG("   insert: format %d (from %d, length %d, strpos=%d)", c.format, c.pos, c.length, c.strPos);
            insert_string(c.pos, c.strPos, c.length, c.format, (QTextUndoCommand::Operation)c.operation);
            c.command = QTextUndoCommand::Inserted;
            if (editPos != (int)c.pos)
                editLength = 0;
            editPos = c.pos;
            editLength += c.length;
            break;
        case QTextUndoCommand::BlockInserted:
        case QTextUndoCommand::BlockAdded:
            remove_block(c.pos, &c.blockFormat, c.command, (QTextUndoCommand::Operation)c.operation);
            PMDEBUG("   blockremove: from %d", c.pos);
            if (c.command == QTextUndoCommand::BlockInserted)
                c.command = QTextUndoCommand::BlockRemoved;
            else
                c.command = QTextUndoCommand::BlockDeleted;
            editPos = c.pos;
            editLength = 0;
            break;
        case QTextUndoCommand::BlockRemoved:
        case QTextUndoCommand::BlockDeleted:
            PMDEBUG("   blockinsert: charformat %d blockformat %d (pos %d, strpos=%d)", c.format, c.blockFormat, c.pos, c.strPos);
            insert_block(c.pos, c.strPos, c.format, c.blockFormat, (QTextUndoCommand::Operation)c.operation, c.command);
            resetBlockRevision += 1;
            if (c.command == QTextUndoCommand::BlockRemoved)
                c.command = QTextUndoCommand::BlockInserted;
            else
                c.command = QTextUndoCommand::BlockAdded;
            if (editPos != (int)c.pos)
                editLength = 0;
            editPos = c.pos;
            editLength += 1;
            break;
        case QTextUndoCommand::CharFormatChanged: {
            resetBlockRevision = -1; // ## TODO
            PMDEBUG("   charFormat: format %d (from %d, length %d)", c.format, c.pos, c.length);
            FragmentIterator it = find(c.pos);
            Q_ASSERT(!it.atEnd());

            int oldFormat = it.value()->format;
            setCharFormat(c.pos, c.length, formats.charFormat(c.format));
            c.format = oldFormat;
            if (editPos != (int)c.pos)
                editLength = 0;
            editPos = c.pos;
            editLength += c.length;
            break;
        }
        case QTextUndoCommand::BlockFormatChanged: {
            resetBlockRevision = -1; // ## TODO
            PMDEBUG("   blockformat: format %d pos %d", c.format, c.pos);
            QTextBlock it = blocksFind(c.pos);
            Q_ASSERT(it.isValid());

            int oldFormat = block(it)->format;
            block(it)->format = c.format;
            QTextBlockGroup *oldGroup = qobject_cast<QTextBlockGroup *>(objectForFormat(formats.blockFormat(oldFormat)));
            QTextBlockGroup *group = qobject_cast<QTextBlockGroup *>(objectForFormat(formats.blockFormat(c.format)));
            c.format = oldFormat;
            if (group != oldGroup) {
                if (oldGroup)
                    oldGroup->blockRemoved(it);
                if (group)
                    group->blockInserted(it);
            } else if (group) {
                group->blockFormatChanged(it);
            }
            documentChange(it.position(), it.length());
            editPos = -1;
            break;
        }
        case QTextUndoCommand::GroupFormatChange: {
            resetBlockRevision = -1; // ## TODO
            PMDEBUG("   group format change");
            QTextObject *object = objectForIndex(c.objectIndex);
            int oldFormat = formats.objectFormatIndex(c.objectIndex);
            changeObjectFormat(object, c.format);
            c.format = oldFormat;
            editPos = -1;
            break;
        }
        case QTextUndoCommand::CursorMoved:
            editPos = c.pos;
            editLength = 0;
            break;
        case QTextUndoCommand::Custom:
            resetBlockRevision = -1; // ## TODO
            if (undo)
                c.custom->undo();
            else
                c.custom->redo();
            editPos = -1;
            break;
        default:
            Q_ASSERT(false);
        }

        if (resetBlockRevision >= 0) {
            int b = blocks.findNode(resetBlockRevision);
            QTextBlockData *B = blocks.fragment(b);
            B->revision = c.revision;
        }

        if (!undo)
            ++undoState;

        bool inBlock = (
                undoState > 0
                && undoState < undoStack.size()
                && undoStack.at(undoState).block_part
                && undoStack.at(undoState - 1).block_part
                && !undoStack.at(undoState - 1).block_end
                );
        if (!inBlock)
            break;
    }
    undoEnabled = true;

    int newCursorPos = -1;

    if (editPos >=0)
        newCursorPos = editPos + editLength;
    else if (docChangeFrom >= 0)
        newCursorPos= qMin(docChangeFrom + docChangeLength, length() - 1);

    endEditBlock();
    emitUndoAvailable(isUndoAvailable());
    emitRedoAvailable(isRedoAvailable());

    return newCursorPos;
}